

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.cpp
# Opt level: O2

void duckdb_zstd::ZSTD_initFseState(ZSTD_fseState *DStatePtr,BIT_DStream_t *bitD,ZSTD_seqSymbol *dt)

{
  U32 UVar1;
  char *pcVar2;
  char *pcVar3;
  uint uVar4;
  uint uVar5;
  
  UVar1 = dt->baseValue;
  uVar5 = bitD->bitsConsumed + UVar1;
  bitD->bitsConsumed = uVar5;
  DStatePtr->state = ~(-1L << ((byte)UVar1 & 0x3f)) & bitD->bitContainer >> (-(char)uVar5 & 0x3fU);
  if (uVar5 < 0x41) {
    pcVar2 = bitD->ptr;
    if (pcVar2 < bitD->limitPtr) {
      pcVar3 = bitD->start;
      if (pcVar2 != pcVar3) {
        uVar4 = (int)pcVar2 - (int)pcVar3;
        if (pcVar3 <= pcVar2 + -(ulong)(uVar5 >> 3)) {
          uVar4 = uVar5 >> 3;
        }
        bitD->ptr = pcVar2 + -(ulong)uVar4;
        bitD->bitsConsumed = uVar5 + uVar4 * -8;
        bitD->bitContainer = *(BitContainerType *)(pcVar2 + -(ulong)uVar4);
      }
    }
    else {
      BIT_reloadDStream_internal(bitD);
    }
  }
  else {
    bitD->ptr = "";
  }
  DStatePtr->table = dt + 1;
  return;
}

Assistant:

static void
ZSTD_initFseState(ZSTD_fseState* DStatePtr, BIT_DStream_t* bitD, const ZSTD_seqSymbol* dt)
{
    const void* ptr = dt;
    const ZSTD_seqSymbol_header* const DTableH = (const ZSTD_seqSymbol_header*)ptr;
    DStatePtr->state = BIT_readBits(bitD, DTableH->tableLog);
    DEBUGLOG(6, "ZSTD_initFseState : val=%u using %u bits",
                (U32)DStatePtr->state, DTableH->tableLog);
    BIT_reloadDStream(bitD);
    DStatePtr->table = dt + 1;
}